

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O3

void __thiscall lumeview::Renderer::Renderer(Renderer *this)

{
  Shader *this_00;
  long lVar1;
  
  (this->m_stages).
  super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_stages).
  super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stages).
  super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->m_shaders[0];
  lVar1 = 0;
  do {
    Shader::Shader(this_00);
    lVar1 = lVar1 + -0x10;
    this_00 = this_00 + 1;
  } while (lVar1 != -0x1b0);
  (this->m_shaderPath)._M_dataplus._M_p = (pointer)&(this->m_shaderPath).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_shaderPath,SHADER_PATH_abi_cxx11_,
             DAT_001e1f40 + SHADER_PATH_abi_cxx11_);
  return;
}

Assistant:

Renderer::
Renderer() :
	m_shaderPath (SHADER_PATH)
{}